

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O2

bool __thiscall
soul::
Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>::
matches(Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
        *this,char *name)

{
  bool bVar1;
  
  bVar1 = matches(this,(TokenType)0x275bb9);
  if (bVar1) {
    bVar1 = std::operator==(&this->currentStringValue,name);
    return bVar1;
  }
  return false;
}

Assistant:

bool matches (const char* name) const                       { return matches (Token::identifier) && currentStringValue == name; }